

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint8_t uVar1;
  char *pcVar2;
  
  do {
    uVar1 = calculate();
    pcVar2 = "Execution completed";
    if (uVar1 == '\0') {
LAB_001024ec:
      std::operator<<((ostream *)&std::cout,pcVar2);
    }
    else if (uVar1 == '\x01') {
      pcVar2 = "Syntax ERROR";
      goto LAB_001024ec;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    ignore();
  } while( true );
}

Assistant:

int main() {
    while (true) {
        uint8_t result = calculate();
        switch (result) {
            case 0:
                cout << "Execution completed";
                break;
            case 1:
                cout << "Syntax ERROR";
        }
        cout << endl;
        ::ignore();
    }
}